

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  pointer pPVar2;
  pointer pPVar3;
  _Rb_tree_color _Var4;
  pointer puVar5;
  pointer pPVar6;
  int iVar7;
  P2PSocket *this;
  Events *pEVar8;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar9;
  Peers *pPVar10;
  ostream *poVar11;
  allocator_type *__a;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  int iVar13;
  pointer __p;
  _Base_ptr p_Var14;
  initializer_list<unsigned_short> __l;
  unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> sock;
  vector<unsigned_short,_std::allocator<unsigned_short>_> knownPorts;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> msgs;
  sigaction action;
  undefined1 local_228 [8];
  undefined1 local_220 [24];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_208;
  ulong local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr p_Stack_1e0;
  _Base_ptr local_1d8;
  size_t sStack_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  undefined8 uStack_1b0;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> local_1a0;
  undefined8 local_188;
  undefined8 uStack_180;
  code *local_178;
  code *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  code *local_158;
  code *local_150;
  _union_1457 local_148 [2];
  long local_138 [17];
  Event local_b0;
  Event local_70;
  
  local_148[0]._0_2_ = 0x1a66;
  __a = (allocator_type *)local_228;
  __l._M_len = 1;
  __l._M_array = (iterator)local_148;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_208,__l,__a);
  this = (P2PSocket *)operator_new(0xb0);
  P2PSocket::P2PSocket(this,2,false);
  local_148[0].sa_handler = (__sighandler_t)0x0;
  std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::~unique_ptr
            ((unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> *)local_148);
  local_148[0].sa_handler = (__sighandler_t)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"127.0.0.1","");
  P2PSocket::createServer(this,(string *)local_148,0x22ba);
  if (local_148[0].sa_handler != (__sighandler_t)local_138) {
    operator_delete(local_148[0].sa_handler,local_138[0] + 1);
  }
  pEVar8 = P2PSocket::events(this);
  puVar9 = Events::onPeerConnect(pEVar8);
  local_168 = 0;
  uStack_160 = 0;
  local_150 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:26:9)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:26:9)>
              ::_M_manager;
  Event::listen(&local_70,
                (int)(puVar9->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_168);
  std::vector<Callable,_std::allocator<Callable>_>::~vector(&local_70.m_listeners);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_name._M_dataplus._M_p != &local_70.m_name.field_2) {
    operator_delete(local_70.m_name._M_dataplus._M_p,
                    local_70.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,3);
  }
  pEVar8 = P2PSocket::events(this);
  puVar9 = Events::onPeerDisconnect(pEVar8);
  local_188 = 0;
  uStack_180 = 0;
  local_170 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:28:9)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(Peer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]p2p-tcpip-socket-cpp/main.cpp:28:9)>
              ::_M_manager;
  Event::listen(&local_b0,
                (int)(puVar9->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
                     super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
                     super__Head_base<0UL,_Event_*,_false>._M_head_impl,(int)&local_188);
  std::vector<Callable,_std::allocator<Callable>_>::~vector(&local_b0.m_listeners);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_name._M_dataplus._M_p != &local_b0.m_name.field_2) {
    operator_delete(local_b0.m_name._M_dataplus._M_p,
                    local_b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,3);
  }
  local_1f0 = (ulong)((long)local_208.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_208.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 1;
  local_148[0] = (_union_1457)0x1;
  iVar13 = 0;
  sigaction(0xd,(sigaction *)local_148,(sigaction *)0x0);
  uVar12 = extraout_RDX;
  do {
    P2PSocket::listen(this,0,(int)uVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"listening\n",10);
    puVar5 = local_208.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (p_Var14 = (_Base_ptr)
                   local_208.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start; p_Var14 != (_Base_ptr)puVar5;
        p_Var14 = (_Base_ptr)((long)&p_Var14->_M_color + 2)) {
      if (iVar13 < (int)(_Rb_tree_color)local_1f0) {
        _Var4 = p_Var14->_M_color;
        local_228 = (undefined1  [8])(local_220 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"127.0.0.1","");
        P2PSocket::connect(this,(int)(string *)local_228,(sockaddr *)(ulong)(ushort)(short)_Var4,
                           (socklen_t)__a);
        if (local_228 != (undefined1  [8])(local_220 + 8)) {
          operator_delete((void *)local_228,local_220._8_8_ + 1);
        }
        iVar13 = iVar13 + 1;
      }
    }
    pPVar10 = P2PSocket::peers(this);
    iVar7 = Peers::count(pPVar10);
    if (0 < iVar7) {
      pPVar10 = P2PSocket::peers(this);
      local_228 = (undefined1  [8])(local_220 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"Broadcasting...","");
      local_1b8 = (code *)0x0;
      uStack_1b0 = 0;
      local_1c8._M_unused._M_object = (void *)0x0;
      local_1c8._8_8_ = 0;
      iVar7 = Peers::broadcast(pPVar10,(string *)local_228,
                               (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>
                                *)&local_1c8);
      if (local_1b8 != (code *)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      if (local_228 != (undefined1  [8])(local_220 + 8)) {
        operator_delete((void *)local_228,local_220._8_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sent: ",6);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," msgs\n",6);
      pPVar10 = P2PSocket::peers(this);
      local_1d8 = (_Base_ptr)0x0;
      sStack_1d0 = 0;
      local_1e8 = (_Base_ptr)0x0;
      p_Stack_1e0 = (_Base_ptr)0x0;
      __a = (allocator_type *)&local_1e8;
      Peers::read((Peers *)local_228,(int)pPVar10,(void *)0x400,(size_t)__a);
      PeersMessages::all(&local_1a0,(PeersMessages *)local_228);
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector
                ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)local_220);
      pPVar2 = local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar3 = local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_1d8 != (_Base_ptr)0x0) {
        (*(code *)local_1d8)(&local_1e8,&local_1e8,3);
        pPVar2 = local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar3 = local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pPVar6 = local_1a0.
                      super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
          pPVar2 != local_1a0.
                    super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
                    super__Vector_impl_data._M_finish; pPVar2 = pPVar2 + 1) {
        local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
        super__Vector_impl_data._M_finish = pPVar3;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Recieved message: ",0x12);
        local_228 = (undefined1  [8])(local_220 + 8);
        pcVar1 = (pPVar2->m_message)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar1,pcVar1 + (pPVar2->m_message)._M_string_length);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_228,local_220._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," from ",6);
        Peer::port(pPVar2->m_peer);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if (local_228 != (undefined1  [8])(local_220 + 8)) {
          operator_delete((void *)local_228,local_220._8_8_ + 1);
        }
        pPVar3 = local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
        super__Vector_impl_data._M_finish = pPVar6;
      }
      local_1a0.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar3;
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector(&local_1a0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sleeping...",0xb);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    sleep(2);
    uVar12 = extraout_RDX_00;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    std::vector<uint16_t> knownPorts = {
        6758,
    };

    std::unique_ptr<P2PSocket> sock = nullptr;

    try {
        sock = std::make_unique<P2PSocket>(2);
        sock->createServer("127.0.0.1", 8890);
    } catch(const P2PSocketException &e) {
        std::cout << e.what() << std::endl;
    }

    sock->events()->onPeerConnect()->listen(
        [](auto &&) { std::cout << "A new peer connected" << std::endl; });
    sock->events()->onPeerDisconnect()->listen(
        [](auto &&) { std::cout << "A peer disconnected" << std::endl; });

    int total = knownPorts.size();
    int connected = 0;

    struct sigaction action;
    action.sa_handler = SIG_IGN;
    sigaction(SIGPIPE, &action, 0);

    while (true) {
        try {
            sock->listen();
            std::cout << "listening\n";
        } catch (const P2PSocketException &e) {
            // std::cout << e.what() << std::endl;
        }

        for (auto port : knownPorts) {
            if (connected < total) {
                try {
                    sock->connect("127.0.0.1", port);
                } catch (const P2PSocketException &e) {
                    std::cout << e.what();
                }
                ++connected;
            }
        }

        auto peersCount = sock->peers()->count();

        if (peersCount > 0) {
            try {
                int bytes = sock->peers()->broadcast("Broadcasting...");
                std::cout << "Sent: " << bytes << " msgs\n";
            } catch (...) {
            }
            try {
                auto msgs = sock->peers()->read().all();
                for (const auto &msg : msgs) {
                    std::cout << "Recieved message: " << msg.message() << " from "
                              << msg.peer()->port() << "\n";
                }
            } catch (const PeerException &e) {
                std::cout << "No messages\n";
            }
        }

        std::cout << "Sleeping..." << connected << "\n";
        sleep(2);
    }

    std::cout << "Done, exiting...\n";
    return 0;
}